

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O2

CURLcode ossl_set_engine_default(Curl_easy *data)

{
  ENGINE *e;
  curl_trc_feat *pcVar1;
  int iVar2;
  char *pcVar3;
  CURLcode CVar4;
  
  e = (ENGINE *)(data->state).engine;
  CVar4 = CURLE_OK;
  if (e != (ENGINE *)0x0) {
    iVar2 = ENGINE_set_default(e,0xffff);
    if (iVar2 < 1) {
      pcVar3 = ENGINE_get_id((ENGINE *)(data->state).engine);
      Curl_failf(data,"set default crypto engine \'%s\' failed",pcVar3);
      CVar4 = CURLE_SSL_ENGINE_SETFAILED;
    }
    else if ((((data->set).field_0x89f & 0x40) != 0) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
             (CVar4 = CURLE_OK, 0 < pcVar1->log_level)))) {
      pcVar3 = ENGINE_get_id((ENGINE *)(data->state).engine);
      CVar4 = CURLE_OK;
      Curl_infof(data,"set default crypto engine \'%s\'",pcVar3);
    }
  }
  return CVar4;
}

Assistant:

static CURLcode ossl_set_engine_default(struct Curl_easy *data)
{
#ifdef USE_OPENSSL_ENGINE
  if(data->state.engine) {
    if(ENGINE_set_default(data->state.engine, ENGINE_METHOD_ALL) > 0) {
      infof(data, "set default crypto engine '%s'",
            ENGINE_get_id(data->state.engine));
    }
    else {
      failf(data, "set default crypto engine '%s' failed",
            ENGINE_get_id(data->state.engine));
      return CURLE_SSL_ENGINE_SETFAILED;
    }
  }
#else
  (void) data;
#endif
  return CURLE_OK;
}